

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytypes.h
# Opt level: O0

tommy_uint32_t tommy_roundup_pow2_u32(tommy_uint32_t value)

{
  uint uVar1;
  long in_FS_OFFSET;
  tommy_uint32_t value_local;
  
  uVar1 = value - 1 | value - 1 >> 1;
  uVar1 = uVar1 | uVar1 >> 2;
  uVar1 = uVar1 | uVar1 >> 4;
  uVar1 = uVar1 | uVar1 >> 8;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (uVar1 | uVar1 >> 0x10) + 1;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline tommy_uint32_t tommy_roundup_pow2_u32(tommy_uint32_t value)
{
	/* Round up to the next highest power of 2 */
	/* from http://graphics.stanford.edu/~seander/bithacks.html */

	--value;
	value |= value >> 1;
	value |= value >> 2;
	value |= value >> 4;
	value |= value >> 8;
	value |= value >> 16;
	++value;

	return value;
}